

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_local_polynomial.hpp
# Opt level: O3

void __thiscall
openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::KLocalPolynomial
          (KLocalPolynomial<openjij::graph::Polynomial<double>_> *this,Binaries *init_binaries,
          json *j)

{
  pointer puVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  const_reference lhs;
  runtime_error *prVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  size_type __new_size;
  long lVar9;
  double threshold;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double> local_98;
  tuple<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
  local_78;
  double local_48;
  undefined8 uStack_40;
  
  this->num_binaries =
       (long)(init_binaries->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(init_binaries->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start >> 2;
  this->rate_call_k_local = 10;
  this->count_call_updater = 0;
  std::vector<int,_std::allocator<int>_>::vector(&this->binaries,init_binaries);
  this->vartype = BINARY;
  (this->dE_v_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->dE_v_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->dE_v_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  memset(&this->dE_,0,0x90);
  std::vector<int,_std::allocator<int>_>::vector(&this->binaries_v_,init_binaries);
  (this->update_index_dE_v_)._M_h._M_buckets = &(this->update_index_dE_v_)._M_h._M_single_bucket;
  (this->update_index_dE_v_)._M_h._M_bucket_count = 1;
  (this->update_index_dE_v_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->update_index_dE_v_)._M_h._M_element_count = 0;
  (this->update_index_dE_v_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->update_index_dE_v_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->update_index_zero_count_v_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->update_index_zero_count_v_).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->update_index_zero_count_v_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->update_index_binaries_v_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->update_index_binaries_v_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->zero_count_v_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->zero_count_v_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->zero_count_v_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cimod::CheckVariables<int>(&this->binaries,&this->vartype);
  lhs = nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::at<const_char_(&)[8],_0>(j,(char (*) [8])"vartype");
  bVar4 = nlohmann::json_abi_v3_11_2::operator!=<const_char_*,_0>(lhs,"BINARY");
  if (bVar4) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Only binary variables are supported");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  graph::json_parse_polynomial<double>(&local_78,j,true);
  __new_size = ((long)local_78.
                      super__Tuple_impl<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
                      .
                      super__Head_base<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
                      ._M_head_impl.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_78.
                      super__Tuple_impl<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
                      .
                      super__Head_base<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
                      ._M_head_impl.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (__new_size -
      ((long)local_78.
             super__Tuple_impl<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
             .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
             super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl
             .super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_78.
             super__Tuple_impl<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
             .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
             super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl
             .super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3) == 0) {
    if (local_78.
        super__Tuple_impl<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
        .
        super__Head_base<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_78.
        super__Tuple_impl<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
        .
        super__Head_base<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      this->num_interactions_ = __new_size;
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::resize(&this->poly_key_list_,__new_size);
      std::vector<double,_std::allocator<double>_>::resize
                (&this->poly_value_list_,this->num_interactions_);
      if (0 < this->num_interactions_) {
        lVar9 = 0;
        lVar8 = 0;
        do {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     ((long)&(((this->poly_key_list_).
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data + lVar9),
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     ((long)&((local_78.
                               super__Tuple_impl<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
                               .
                               super__Head_base<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
                               ._M_head_impl.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar9));
          (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar8] =
               local_78.
               super__Tuple_impl<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
               .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
               super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>.
               _M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8];
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + 0x18;
        } while (lVar8 < this->num_interactions_);
      }
      SortInteractions(this);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->active_binaries_,this->num_binaries);
      auVar3 = _DAT_001d8020;
      puVar1 = (this->active_binaries_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (this->active_binaries_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar1 != puVar2) {
        uVar6 = (long)puVar2 + (-8 - (long)puVar1);
        auVar12._8_4_ = (int)uVar6;
        auVar12._0_8_ = uVar6;
        auVar12._12_4_ = (int)(uVar6 >> 0x20);
        auVar10._0_8_ = uVar6 >> 3;
        auVar10._8_8_ = auVar12._8_8_ >> 3;
        uVar7 = 0;
        auVar10 = auVar10 ^ _DAT_001d8020;
        auVar11 = _DAT_001d8010;
        do {
          auVar12 = auVar11 ^ auVar3;
          if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                      auVar10._4_4_ < auVar12._4_4_) & 1)) {
            puVar1[uVar7] = uVar7;
          }
          if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
              auVar12._12_4_ <= auVar10._12_4_) {
            puVar1[uVar7 + 1] = uVar7 + 1;
          }
          uVar7 = uVar7 + 2;
          lVar8 = auVar11._8_8_;
          auVar11._0_8_ = auVar11._0_8_ + 2;
          auVar11._8_8_ = lVar8 + 2;
        } while (((uVar6 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
      }
      SetAdj(this);
      ResetZeroCount(this);
      reset_dE(this);
      FindMaxInteraction(&local_98,this);
      threshold = ABS(local_98.second * 1e-08);
      if (local_98.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        uStack_40 = 0;
        local_48 = ABS(local_98.second * 1e-08);
        operator_delete(local_98.first.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.first.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.first.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        threshold = local_48;
      }
      FindMinInteraction(&local_98,this,threshold);
      this->min_effective_dE_ = ABS(local_98.second);
      if (local_98.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.first.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.first.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.first.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(&local_78.
                 super__Tuple_impl<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
                 .
                 super__Head_base<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
                 ._M_head_impl);
      if (local_78.
          super__Tuple_impl<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
          .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
          super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_78.
                        super__Tuple_impl<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
                        .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
                        super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>.
                        _M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Tuple_impl<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
                              .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>
                              .
                              super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>
                              ._M_head_impl.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Tuple_impl<0UL,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
                              .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>
                              .
                              super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>
                              ._M_head_impl.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"The interaction is empty.");
  }
  else {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar5,"The sizes of key_list and value_list must match each other");
  }
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

KLocalPolynomial(const graph::Binaries &init_binaries,
                   const nlohmann::json &j)
      : num_binaries(init_binaries.size()), binaries(init_binaries),
        binaries_v_(init_binaries) {

    cimod::CheckVariables(binaries, vartype);

    if (j.at("vartype") != "BINARY") {
      throw std::runtime_error("Only binary variables are supported");
    }

    const auto &v_k_v = graph::json_parse_polynomial<FloatType>(j);
    const auto &poly_key_list = std::get<0>(v_k_v);
    const auto &poly_value_list = std::get<1>(v_k_v);

    if (poly_key_list.size() != poly_value_list.size()) {
      throw std::runtime_error(
          "The sizes of key_list and value_list must match each other");
    }
    if (poly_key_list.size() == 0) {
      throw std::runtime_error("The interaction is empty.");
    }

    num_interactions_ = static_cast<int64_t>(poly_key_list.size());

    poly_key_list_.resize(num_interactions_);
    poly_value_list_.resize(num_interactions_);

#pragma omp parallel for
    for (int64_t i = 0; i < num_interactions_; ++i) {
      poly_key_list_[i] = poly_key_list[i];
      poly_value_list_[i] = poly_value_list[i];
    }
    SortInteractions();

    active_binaries_.resize(num_binaries);
    std::iota(active_binaries_.begin(), active_binaries_.end(), 0);

    SetAdj();
    ResetZeroCount();
    reset_dE();
    const FloatType thres_hold =
        std::abs(FindMaxInteraction().second * utility::THRESHOLD<FloatType>);
    min_effective_dE_ = std::abs(FindMinInteraction(thres_hold).second);
  }